

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.c
# Opt level: O0

int ThreadPoolInit(ThreadPool *tp,ThreadPoolAttr *attr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_28;
  int local_24;
  int i;
  int retCode;
  ThreadPoolAttr *attr_local;
  ThreadPool *tp_local;
  
  if (tp == (ThreadPool *)0x0) {
    tp_local._4_4_ = 0x16;
  }
  else {
    iVar1 = pthread_mutex_init((pthread_mutex_t *)tp,(pthread_mutexattr_t *)0x0);
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)tp);
    iVar3 = pthread_cond_init((pthread_cond_t *)&tp->condition,(pthread_condattr_t *)0x0);
    iVar4 = pthread_cond_init((pthread_cond_t *)&tp->start_and_shutdown,(pthread_condattr_t *)0x0);
    if (iVar4 + iVar3 + iVar2 + iVar1 == 0) {
      if (attr == (ThreadPoolAttr *)0x0) {
        TPAttrInit(&tp->attr);
      }
      else {
        memcpy(&tp->attr,attr,0x28);
      }
      iVar1 = SetPolicyType((tp->attr).schedPolicy);
      if (iVar1 == 0) {
        iVar1 = FreeListInit(&tp->jobFreeList,0x30,100);
        StatsInit(&tp->stats);
        iVar2 = ListInit(&tp->highJobQ,CmpThreadPoolJob,(free_function)0x0);
        iVar3 = ListInit(&tp->medJobQ,CmpThreadPoolJob,(free_function)0x0);
        iVar4 = ListInit(&tp->lowJobQ,CmpThreadPoolJob,(free_function)0x0);
        if (iVar4 + iVar3 + iVar2 + iVar1 == 0) {
          tp->persistentJob = (ThreadPoolJob *)0x0;
          tp->lastJobId = 0;
          tp->shutdown = 0;
          tp->totalThreads = 0;
          tp->busyThreads = 0;
          tp->persistentThreads = 0;
          tp->pendingWorkerThreadStart = 0;
          local_28 = 0;
          local_24 = 0;
          while ((local_28 < (tp->attr).minThreads && (local_24 = CreateWorker(tp), local_24 == 0)))
          {
            local_28 = local_28 + 1;
          }
        }
        else {
          local_24 = 0xb;
        }
        pthread_mutex_unlock((pthread_mutex_t *)tp);
        if (local_24 != 0) {
          ThreadPoolShutdown(tp);
        }
        tp_local._4_4_ = local_24;
      }
      else {
        pthread_mutex_unlock((pthread_mutex_t *)tp);
        pthread_mutex_destroy((pthread_mutex_t *)tp);
        pthread_cond_destroy((pthread_cond_t *)&tp->condition);
        pthread_cond_destroy((pthread_cond_t *)&tp->start_and_shutdown);
        tp_local._4_4_ = 0x20000000;
      }
    }
    else {
      pthread_mutex_unlock((pthread_mutex_t *)tp);
      pthread_mutex_destroy((pthread_mutex_t *)tp);
      pthread_cond_destroy((pthread_cond_t *)&tp->condition);
      pthread_cond_destroy((pthread_cond_t *)&tp->start_and_shutdown);
      tp_local._4_4_ = 0xb;
    }
  }
  return tp_local._4_4_;
}

Assistant:

int ThreadPoolInit(ThreadPool *tp, ThreadPoolAttr *attr)
{
	int retCode = 0;
	int i = 0;

	if (!tp) {
		return EINVAL;
	}

	retCode += ithread_mutex_init(&tp->mutex, NULL);
	retCode += ithread_mutex_lock(&tp->mutex);

	retCode += ithread_cond_init(&tp->condition, NULL);
	retCode += ithread_cond_init(&tp->start_and_shutdown, NULL);
	if (retCode) {
		ithread_mutex_unlock(&tp->mutex);
		ithread_mutex_destroy(&tp->mutex);
		ithread_cond_destroy(&tp->condition);
		ithread_cond_destroy(&tp->start_and_shutdown);
		return EAGAIN;
	}
	if (attr) {
		tp->attr = *attr;
	} else {
		TPAttrInit(&tp->attr);
	}
	if (SetPolicyType(tp->attr.schedPolicy) != 0) {
		ithread_mutex_unlock(&tp->mutex);
		ithread_mutex_destroy(&tp->mutex);
		ithread_cond_destroy(&tp->condition);
		ithread_cond_destroy(&tp->start_and_shutdown);

		return INVALID_POLICY;
	}
	retCode += FreeListInit(
		&tp->jobFreeList, sizeof(ThreadPoolJob), JOBFREELISTSIZE);
	StatsInit(&tp->stats);
	retCode += ListInit(&tp->highJobQ, CmpThreadPoolJob, NULL);
	retCode += ListInit(&tp->medJobQ, CmpThreadPoolJob, NULL);
	retCode += ListInit(&tp->lowJobQ, CmpThreadPoolJob, NULL);
	if (retCode) {
		retCode = EAGAIN;
	} else {
		tp->persistentJob = NULL;
		tp->lastJobId = 0;
		tp->shutdown = 0;
		tp->totalThreads = 0;
		tp->busyThreads = 0;
		tp->persistentThreads = 0;
		tp->pendingWorkerThreadStart = 0;
		for (i = 0; i < tp->attr.minThreads; ++i) {
			retCode = CreateWorker(tp);
			if (retCode) {
				break;
			}
		}
	}

	ithread_mutex_unlock(&tp->mutex);

	if (retCode) {
		/* clean up if the min threads could not be created */
		ThreadPoolShutdown(tp);
	}

	return retCode;
}